

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O1

void __thiscall CVmObjFrameRef::mark_refs(CVmObjFrameRef *this,uint state)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  uint *puVar5;
  
  pcVar3 = (this->super_CVmObject).ext_;
  if (*(int *)(pcVar3 + 8) == 5) {
    uVar1 = *(uint *)(pcVar3 + 0x10);
    CVmObjTable::add_to_gc_queue
              (&G_obj_table_X,uVar1,
               (CVmObjPageEntry *)
               ((long)&G_obj_table_X.pages_[uVar1 >> 0xc]->ptr_ + (ulong)((uVar1 & 0xfff) * 0x18)),
               state);
  }
  if (*(int *)(pcVar3 + 0x28) == 5) {
    uVar1 = *(uint *)(pcVar3 + 0x30);
    CVmObjTable::add_to_gc_queue
              (&G_obj_table_X,uVar1,
               (CVmObjPageEntry *)
               ((long)&G_obj_table_X.pages_[uVar1 >> 0xc]->ptr_ + (ulong)((uVar1 & 0xfff) * 0x18)),
               state);
  }
  uVar1 = *(uint *)(pcVar3 + 0x38);
  if (uVar1 != 0) {
    CVmObjTable::add_to_gc_queue
              (&G_obj_table_X,uVar1,
               (CVmObjPageEntry *)
               ((long)&G_obj_table_X.pages_[uVar1 >> 0xc]->ptr_ + (ulong)((uVar1 & 0xfff) * 0x18)),
               state);
  }
  uVar1 = *(uint *)(pcVar3 + 0x3c);
  if (uVar1 != 0) {
    CVmObjTable::add_to_gc_queue
              (&G_obj_table_X,uVar1,
               (CVmObjPageEntry *)
               ((long)&G_obj_table_X.pages_[uVar1 >> 0xc]->ptr_ + (ulong)((uVar1 & 0xfff) * 0x18)),
               state);
  }
  if (*(int *)(pcVar3 + 0x48) == 5) {
    uVar1 = *(uint *)(pcVar3 + 0x50);
    CVmObjTable::add_to_gc_queue
              (&G_obj_table_X,uVar1,
               (CVmObjPageEntry *)
               ((long)&G_obj_table_X.pages_[uVar1 >> 0xc]->ptr_ + (ulong)((uVar1 & 0xfff) * 0x18)),
               state);
  }
  iVar4 = *(int *)(pcVar3 + 0x20);
  iVar2 = *(int *)(pcVar3 + 0x24);
  if (iVar2 + iVar4 != 0 && SCARRY4(iVar2,iVar4) == iVar2 + iVar4 < 0) {
    puVar5 = (uint *)(pcVar3 + 0x60);
    iVar4 = iVar4 + iVar2 + 1;
    do {
      if (puVar5[-2] == 5) {
        uVar1 = *puVar5;
        CVmObjTable::add_to_gc_queue
                  (&G_obj_table_X,uVar1,
                   (CVmObjPageEntry *)
                   ((long)&G_obj_table_X.pages_[uVar1 >> 0xc]->ptr_ +
                   (ulong)((uVar1 & 0xfff) * 0x18)),state);
      }
      puVar5 = puVar5 + 4;
      iVar4 = iVar4 + -1;
    } while (1 < iVar4);
  }
  return;
}

Assistant:

void CVmObjFrameRef::mark_refs(VMG_ uint state)
{
    /* get the extension */
    vm_frameref_ext *ext = get_ext();

    /* mark the function */
    if (ext->entry.typ == VM_OBJ)
        G_obj_table->mark_all_refs(ext->entry.val.obj, state);

    /* mark the method context objects */
    if (ext->self.typ == VM_OBJ)
        G_obj_table->mark_all_refs(ext->self.val.obj, state);
    if (ext->defobj != VM_INVALID_OBJ)
        G_obj_table->mark_all_refs(ext->defobj, state);
    if (ext->targobj != VM_INVALID_OBJ)
        G_obj_table->mark_all_refs(ext->targobj, state);

    /* mark the invokee */
    if (ext->invokee.typ == VM_OBJ)
        G_obj_table->mark_all_refs(ext->invokee.val.obj, state);

    /* mark each snapshot variable */
    int i;
    const vm_val_t *v;
    for (i = ext->nlocals + ext->nparams, v = ext->vars ; i > 0 ; --i, ++v)
    {
        if (v->typ == VM_OBJ)
            G_obj_table->mark_all_refs(v->val.obj, state);
    }
}